

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O2

void highbd_filter_src_pixels
               (__m128i *src,__m128i *src2,__m128i *tmp,__m128i *coeff,int offset_bits_horiz,
               int reduce_bits_horiz,int k)

{
  __m128i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i alVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  alVar12 = *src;
  alVar1 = *src2;
  iVar9 = ((1 << ((byte)reduce_bits_horiz & 0x1f)) >> 1) + (1 << ((byte)offset_bits_horiz & 0x1f));
  auVar10 = pmaddwd((undefined1  [16])*coeff,(undefined1  [16])alVar12);
  auVar2._16_8_ = alVar1[0];
  auVar2._24_8_ = alVar1[1];
  auVar2._0_8_ = alVar12[0];
  auVar2._8_8_ = alVar12[1];
  auVar13 = pmaddwd(auVar2._4_16_,(undefined1  [16])coeff[2]);
  auVar3._16_8_ = alVar1[0];
  auVar3._24_8_ = alVar1[1];
  auVar3._0_8_ = alVar12[0];
  auVar3._8_8_ = alVar12[1];
  auVar15 = pmaddwd(auVar3._8_16_,(undefined1  [16])coeff[4]);
  auVar4._16_8_ = alVar1[0];
  auVar4._24_8_ = alVar1[1];
  auVar4._0_8_ = alVar12[0];
  auVar4._8_8_ = alVar12[1];
  auVar16 = pmaddwd(auVar4._12_16_,(undefined1  [16])coeff[6]);
  auVar14 = ZEXT416((uint)reduce_bits_horiz);
  auVar11._0_4_ = auVar10._0_4_ + iVar9 + auVar13._0_4_ + auVar16._0_4_ + auVar15._0_4_ >> auVar14;
  auVar11._4_4_ = auVar10._4_4_ + iVar9 + auVar13._4_4_ + auVar16._4_4_ + auVar15._4_4_ >> auVar14;
  auVar11._8_4_ = auVar10._8_4_ + iVar9 + auVar13._8_4_ + auVar16._8_4_ + auVar15._8_4_ >> auVar14;
  auVar11._12_4_ =
       auVar10._12_4_ + iVar9 + auVar13._12_4_ + auVar16._12_4_ + auVar15._12_4_ >> auVar14;
  auVar5._16_8_ = alVar1[0];
  auVar5._24_8_ = alVar1[1];
  auVar5._0_8_ = alVar12[0];
  auVar5._8_8_ = alVar12[1];
  auVar13 = pmaddwd(auVar5._2_16_,(undefined1  [16])coeff[1]);
  auVar6._16_8_ = alVar1[0];
  auVar6._24_8_ = alVar1[1];
  auVar6._0_8_ = alVar12[0];
  auVar6._8_8_ = alVar12[1];
  auVar16 = pmaddwd(auVar6._6_16_,(undefined1  [16])coeff[3]);
  auVar7._16_8_ = alVar1[0];
  auVar7._24_8_ = alVar1[1];
  auVar7._0_8_ = alVar12[0];
  auVar7._8_8_ = alVar12[1];
  auVar17 = pmaddwd(auVar7._10_16_,(undefined1  [16])coeff[5]);
  auVar8._16_8_ = alVar1[0];
  auVar8._24_8_ = alVar1[1];
  auVar8._0_8_ = alVar12[0];
  auVar8._8_8_ = alVar12[1];
  auVar10 = pmaddwd(auVar8._14_16_,(undefined1  [16])coeff[7]);
  auVar15._0_4_ = auVar13._0_4_ + iVar9 + auVar17._0_4_ + auVar16._0_4_ + auVar10._0_4_ >> auVar14;
  auVar15._4_4_ = auVar13._4_4_ + iVar9 + auVar17._4_4_ + auVar16._4_4_ + auVar10._4_4_ >> auVar14;
  auVar15._8_4_ = auVar13._8_4_ + iVar9 + auVar17._8_4_ + auVar16._8_4_ + auVar10._8_4_ >> auVar14;
  auVar15._12_4_ =
       auVar13._12_4_ + iVar9 + auVar17._12_4_ + auVar16._12_4_ + auVar10._12_4_ >> auVar14;
  alVar12 = (__m128i)packssdw(auVar11,auVar15);
  tmp[(long)k + 7] = alVar12;
  return;
}

Assistant:

static inline void highbd_filter_src_pixels(
    const __m128i *src, const __m128i *src2, __m128i *tmp, __m128i *coeff,
    const int offset_bits_horiz, const int reduce_bits_horiz, int k) {
  const __m128i src_1 = *src;
  const __m128i src2_1 = *src2;

  const __m128i round_const = _mm_set1_epi32((1 << offset_bits_horiz) +
                                             ((1 << reduce_bits_horiz) >> 1));

  const __m128i res_0 = _mm_madd_epi16(src_1, coeff[0]);
  const __m128i res_2 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 4), coeff[2]);
  const __m128i res_4 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 8), coeff[4]);
  const __m128i res_6 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 12), coeff[6]);

  __m128i res_even =
      _mm_add_epi32(_mm_add_epi32(res_0, res_4), _mm_add_epi32(res_2, res_6));
  res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const),
                           _mm_cvtsi32_si128(reduce_bits_horiz));

  const __m128i res_1 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 2), coeff[1]);
  const __m128i res_3 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 6), coeff[3]);
  const __m128i res_5 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 10), coeff[5]);
  const __m128i res_7 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 14), coeff[7]);

  __m128i res_odd =
      _mm_add_epi32(_mm_add_epi32(res_1, res_5), _mm_add_epi32(res_3, res_7));
  res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const),
                          _mm_cvtsi32_si128(reduce_bits_horiz));

  // Combine results into one register.
  // We store the columns in the order 0, 2, 4, 6, 1, 3, 5, 7
  // as this order helps with the vertical filter.
  tmp[k + 7] = _mm_packs_epi32(res_even, res_odd);
}